

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

DiyFp __thiscall double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  int iVar1;
  DiyFp DVar2;
  int e;
  uint64_t f;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ulong local_20;
  undefined1 local_10 [12];
  
  local_20 = Significand((Double *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar1 = Exponent((Double *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (; (local_20 & 0x10000000000000) == 0; local_20 = local_20 << 1) {
    iVar1 = iVar1 + -1;
  }
  DiyFp::DiyFp((DiyFp *)local_10,local_20 << 0xb,iVar1 + -0xb);
  DVar2._12_4_ = 0;
  DVar2.f_ = local_10._0_8_;
  DVar2.e_ = local_10._8_4_;
  return DVar2;
}

Assistant:

DiyFp AsNormalizedDiyFp() const {
    DOUBLE_CONVERSION_ASSERT(value() > 0.0);
    uint64_t f = Significand();
    int e = Exponent();

    // The current double could be a denormal.
    while ((f & kHiddenBit) == 0) {
      f <<= 1;
      e--;
    }
    // Do the final shifts in one go.
    f <<= DiyFp::kSignificandSize - kSignificandSize;
    e -= DiyFp::kSignificandSize - kSignificandSize;
    return DiyFp(f, e);
  }